

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c0738::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody
          (DebugCounterTest_RealProvidesReportAtExit_Test *this)

{
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  bool expect_output;
  AssertHelper local_f0;
  Message local_e8;
  int local_dc;
  exception *gtest_exception;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  ReturnSentinel local_70;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  local_60;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_30;
  pointer local_18;
  DeathTest *gtest_dt;
  DebugCounterTest_RealProvidesReportAtExit_Test *this_local;
  
  gtest_dt = (DeathTest *)this;
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_00548308;
  ::(anonymous_namespace)::MatchOutput_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)0x1,expect_output);
  testing::internal::MakeDeathTestMatcher(&local_30,&local_48);
  bVar2 = testing::internal::DeathTest::Create
                    ("{ static google::protobuf::internal::RealDebugCounter counter1(\"Foo.Bar\"); static google::protobuf::internal::RealDebugCounter counter2(\"Foo.Baz\"); static google::protobuf::internal::RealDebugCounter counter3(\"Num.32\"); static google::protobuf::internal::RealDebugCounter counter4(\"Num.128\"); counter1.Inc(); counter2.Inc(); counter2.Inc(); counter3.Inc(); counter3.Inc(); counter3.Inc(); counter4.Inc(); exit(0); }"
                     ,&local_30,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
                     ,0x39,&local_18);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_30);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_48);
  if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00548308;
  if (local_18 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&local_60,local_18);
  iVar3 = (*local_18->_vptr_DeathTest[2])();
  pDVar1 = local_18;
  if (iVar3 == 0) {
    testing::ExitedWithCode::ExitedWithCode((ExitedWithCode *)((long)&gtest_sentinel.test_ + 4),0);
    iVar3 = (*local_18->_vptr_DeathTest[3])();
    bVar2 = testing::ExitedWithCode::operator()
                      ((ExitedWithCode *)((long)&gtest_sentinel.test_ + 4),iVar3);
    iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
    if ((((byte)iVar3 ^ 0xff) & 1) == 0) goto LAB_005482d0;
    local_dc = 2;
  }
  else {
    if (iVar3 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_70,local_18);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::
             counter1 == '\0') &&
           (iVar3 = __cxa_guard_acquire(&::(anonymous_namespace)::
                                         DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()
                                         ::counter1), iVar3 != 0)) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_80,"Foo.Bar");
          google::protobuf::internal::RealDebugCounter::RealDebugCounter
                    (&TestBody::counter1,local_80);
          __cxa_guard_release(&::(anonymous_namespace)::
                               DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::counter1)
          ;
        }
        if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::
             counter2 == '\0') &&
           (iVar3 = __cxa_guard_acquire(&::(anonymous_namespace)::
                                         DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()
                                         ::counter2), iVar3 != 0)) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_90,"Foo.Baz");
          google::protobuf::internal::RealDebugCounter::RealDebugCounter
                    (&TestBody::counter2,local_90);
          __cxa_guard_release(&::(anonymous_namespace)::
                               DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::counter2)
          ;
        }
        if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::
             counter3 == '\0') &&
           (iVar3 = __cxa_guard_acquire(&::(anonymous_namespace)::
                                         DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()
                                         ::counter3), iVar3 != 0)) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_a0,"Num.32");
          google::protobuf::internal::RealDebugCounter::RealDebugCounter
                    (&TestBody::counter3,local_a0);
          __cxa_guard_release(&::(anonymous_namespace)::
                               DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::counter3)
          ;
        }
        if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::
             counter4 == '\0') &&
           (iVar3 = __cxa_guard_acquire(&::(anonymous_namespace)::
                                         DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()
                                         ::counter4), iVar3 != 0)) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_exception,"Num.128")
          ;
          google::protobuf::internal::RealDebugCounter::RealDebugCounter
                    (&TestBody::counter4,_gtest_exception);
          __cxa_guard_release(&::(anonymous_namespace)::
                               DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::counter4)
          ;
        }
        google::protobuf::internal::RealDebugCounter::Inc(&TestBody::counter1);
        google::protobuf::internal::RealDebugCounter::Inc(&TestBody::counter2);
        google::protobuf::internal::RealDebugCounter::Inc(&TestBody::counter2);
        google::protobuf::internal::RealDebugCounter::Inc(&TestBody::counter3);
        google::protobuf::internal::RealDebugCounter::Inc(&TestBody::counter3);
        google::protobuf::internal::RealDebugCounter::Inc(&TestBody::counter3);
        google::protobuf::internal::RealDebugCounter::Inc(&TestBody::counter4);
        exit(0);
      }
      (*local_18->_vptr_DeathTest[5])(local_18,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_70);
    }
LAB_005482d0:
    local_dc = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr(&local_60);
  if (local_dc == 0) {
    return;
  }
LAB_00548308:
  testing::Message::Message(&local_e8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
             ,0x39,message);
  testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
  testing::internal::AssertHelper::~AssertHelper(&local_f0);
  testing::Message::~Message(&local_e8);
  return;
}

Assistant:

TEST(DebugCounterTest, RealProvidesReportAtExit) {
  EXPECT_EXIT(
      {
        static google::protobuf::internal::RealDebugCounter counter1("Foo.Bar");
        static google::protobuf::internal::RealDebugCounter counter2("Foo.Baz");
        static google::protobuf::internal::RealDebugCounter counter3("Num.32");
        static google::protobuf::internal::RealDebugCounter counter4("Num.128");
        counter1.Inc();
        counter2.Inc();
        counter2.Inc();
        counter3.Inc();
        counter3.Inc();
        counter3.Inc();
        counter4.Inc();
        exit(0);
      },
      ExitedWithCode(0), MatchOutput(true));
}